

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void matchit::impl::IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
               (_Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                *v,_Variadic_union<mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                   value)

{
  _Variadic_union<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_30;
  undefined1 local_10;
  
  local_10 = 3;
  local_30._M_rest._M_rest = value;
  std::__detail::__variant::
  _Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  ::operator=(v,(_Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                 *)&local_30);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                       *)&local_30);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }